

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-data-getter-setters.c
# Opt level: O0

char * uv_handle_type_name(uv_handle_type type)

{
  char *pcStack_10;
  uv_handle_type type_local;
  
  switch(type) {
  case UV_UNKNOWN_HANDLE:
  case UV_HANDLE_TYPE_MAX:
    pcStack_10 = (char *)0x0;
    break;
  case UV_ASYNC:
    pcStack_10 = "async";
    break;
  case UV_CHECK:
    pcStack_10 = "check";
    break;
  case UV_FS_EVENT:
    pcStack_10 = "fs_event";
    break;
  case UV_FS_POLL:
    pcStack_10 = "fs_poll";
    break;
  case UV_HANDLE:
    pcStack_10 = "handle";
    break;
  case UV_IDLE:
    pcStack_10 = "idle";
    break;
  case UV_NAMED_PIPE:
    pcStack_10 = "pipe";
    break;
  case UV_POLL:
    pcStack_10 = "poll";
    break;
  case UV_PREPARE:
    pcStack_10 = "prepare";
    break;
  case UV_PROCESS:
    pcStack_10 = "process";
    break;
  case UV_STREAM:
    pcStack_10 = "stream";
    break;
  case UV_TCP:
    pcStack_10 = "tcp";
    break;
  case UV_TIMER:
    pcStack_10 = "timer";
    break;
  case UV_TTY:
    pcStack_10 = "tty";
    break;
  case UV_UDP:
    pcStack_10 = "udp";
    break;
  case UV_SIGNAL:
    pcStack_10 = "signal";
    break;
  case UV_FILE:
    pcStack_10 = "file";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* uv_handle_type_name(uv_handle_type type) {
  switch (type) {
#define XX(uc,lc) case UV_##uc: return #lc;
  UV_HANDLE_TYPE_MAP(XX)
#undef XX
  case UV_FILE: return "file";
  case UV_HANDLE_TYPE_MAX:
  case UV_UNKNOWN_HANDLE: return NULL;
  }
  return NULL;
}